

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O1

UINT8 __thiscall
PlayerA::SetOutputSettings
          (PlayerA *this,UINT32 smplRate,UINT8 channels,UINT8 smplBits,UINT32 smplBufferLen)

{
  bool bVar1;
  UINT8 UVar2;
  uint uVar3;
  undefined3 in_register_00000011;
  code *pcVar4;
  
  if (CONCAT31(in_register_00000011,channels) != 2) {
    return 0xf0;
  }
  switch(smplBits * ' ' | (byte)(smplBits - 8) >> 3) {
  case 0:
    pcVar4 = SampleConv_toU8;
    break;
  case 1:
    pcVar4 = SampleConv_toS16;
    break;
  case 2:
    pcVar4 = SampleConv_toS24;
    break;
  case 3:
    pcVar4 = SampleConv_toS32;
    break;
  default:
    bVar1 = true;
    pcVar4 = (PLR_SMPL_PACK)0x0;
    goto LAB_0011f04b;
  }
  bVar1 = false;
LAB_0011f04b:
  UVar2 = 0xf1;
  if (!bVar1) {
    this->_outSmplChns = channels;
    this->_outSmplBits = smplBits;
    this->_outSmplPack = pcVar4;
    SetSampleRate(this,smplRate);
    uVar3 = (uint)(this->_outSmplBits >> 3);
    this->_outSmplSize1 = uVar3;
    this->_outSmplSizeA = this->_outSmplChns * uVar3;
    std::vector<_waveform_32bit_stereo,_std::allocator<_waveform_32bit_stereo>_>::resize
              (&this->_smplBuf,(ulong)smplBufferLen);
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UINT8 PlayerA::SetOutputSettings(UINT32 smplRate, UINT8 channels, UINT8 smplBits, UINT32 smplBufferLen)
{
	if (channels != 2)
		return 0xF0;	// TODO: support channels = 1
	PLR_SMPL_PACK smplPackFunc = GetSampleConvFunc(smplBits);
	if (smplPackFunc == NULL)
		return 0xF1;	// unsupported sample format
	
	_outSmplChns = channels;
	_outSmplBits = smplBits;
	_outSmplPack = smplPackFunc;
	SetSampleRate(smplRate);
	_outSmplSize1 = _outSmplBits / 8;
	_outSmplSizeA = _outSmplSize1 * _outSmplChns;
	_smplBuf.resize(smplBufferLen);
	return 0x00;
}